

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QDate __thiscall QLocale::toDate(QLocale *this,QString *string,FormatType format,int baseYear)

{
  QDate QVar1;
  FormatType in_EDX;
  QString *in_RSI;
  undefined8 in_RDI;
  int baseYear_00;
  long in_FS_OFFSET;
  QString *string_00;
  QLocale *in_stack_ffffffffffffffa8;
  QString local_20;
  long local_8;
  
  baseYear_00 = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  string_00 = &local_20;
  dateFormat((QLocale *)in_RSI,in_EDX);
  QVar1 = toDate(in_stack_ffffffffffffffa8,string_00,in_RSI,baseYear_00);
  QString::~QString((QString *)0x4cf5e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDate)QVar1.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QLocale::toDate(const QString &string, FormatType format, int baseYear) const
{
    return toDate(string, dateFormat(format), baseYear);
}